

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_parameters ZVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_CCtx_params ret;
  ZSTD_CCtx_params in_stack_fffffffffffffed8;
  undefined1 local_a0 [12];
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  ZSTD_strategy ZStack_84;
  ZSTD_frameParameters local_80;
  undefined4 local_74;
  
  ZVar1 = params;
  bVar6 = 0;
  memcpy(local_a0,&cctx->requestedParams,0x78);
  local_a0._4_4_ = params.cParams.windowLog;
  local_a0._8_4_ = params.cParams.chainLog;
  uStack_94 = ZVar1.cParams.hashLog;
  uStack_90 = ZVar1.cParams.searchLog;
  uStack_8c = ZVar1.cParams.searchLength;
  uStack_88 = params.cParams.targetLength;
  ZStack_84 = params.cParams.strategy;
  local_80.contentSizeFlag = params.fParams.contentSizeFlag;
  local_80.checksumFlag = params.fParams.checksumFlag;
  local_80.noDictIDFlag = params.fParams.noDictIDFlag;
  local_74 = 3;
  puVar4 = (undefined8 *)local_a0;
  puVar5 = (undefined8 *)&stack0xfffffffffffffed8;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  sVar2 = ZSTD_compressBegin_advanced_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     in_stack_fffffffffffffed8,pledgedSrcSize);
  return sVar2;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            cctxParams, pledgedSrcSize);
}